

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int message_set_header(MESSAGE_HANDLE message,HEADER_HANDLE header)

{
  HEADER_HANDLE pHVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x1a4;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1a4;
    }
    pcVar5 = "NULL message";
    iVar3 = 0x1a3;
  }
  else {
    if (header == (HEADER_HANDLE)0x0) {
      if (message->header == (HEADER_HANDLE)0x0) {
        return 0;
      }
      header_destroy(message->header);
      message->header = (HEADER_HANDLE)0x0;
      return 0;
    }
    pHVar1 = header_clone(header);
    if (pHVar1 != (HEADER_HANDLE)0x0) {
      if (message->header != (HEADER_HANDLE)0x0) {
        header_destroy(message->header);
      }
      message->header = pHVar1;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x1bf;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1bf;
    }
    pcVar5 = "Cannot clone message header";
    iVar3 = 0x1be;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
            ,"message_set_header",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int message_set_header(MESSAGE_HANDLE message, HEADER_HANDLE header)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_024: [ If `message` is NULL, `message_set_header` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        HEADER_HANDLE new_header;

        if (header == NULL)
        {
            /* Codes_SRS_MESSAGE_01_139: [ If `message_header` is NULL, the previously stored header associated with `message` shall be freed. ]*/
            if (message->header != NULL)
            {
                header_destroy(message->header);
                message->header = NULL;
            }

            /* Codes_SRS_MESSAGE_01_023: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_022: [ `message_set_header` shall copy the contents of `message_header` as the header for the message instance identified by message. ]*/
            /* Codes_SRS_MESSAGE_01_025: [ Cloning the header shall be done by calling `header_clone`. ]*/
            new_header = header_clone(header);
            if (new_header == NULL)
            {
                /* Codes_SRS_MESSAGE_01_026: [ If `header_clone` fails, `message_set_header` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message header");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_138: [ If setting the header fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->header != NULL)
                {
                    header_destroy(message->header);
                }

                message->header = new_header;

                /* Codes_SRS_MESSAGE_01_023: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}